

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

void Timidity::Parse_lart
               (DLS_Data *data,RIFF_Chunk *chunk,CONNECTIONLIST **conn_ptr,CONNECTION **connList_ptr
               )

{
  int local_30;
  DWORD magic;
  CONNECTION **connList_ptr_local;
  CONNECTIONLIST **conn_ptr_local;
  RIFF_Chunk *chunk_local;
  DLS_Data *data_local;
  
  conn_ptr_local = (CONNECTIONLIST **)chunk->child;
  while( true ) {
    if (conn_ptr_local == (CONNECTIONLIST **)0x0) {
      return;
    }
    if (*(int *)conn_ptr_local == 0x5453494c) {
      local_30 = *(int *)(conn_ptr_local + 1);
    }
    else {
      local_30 = *(int *)conn_ptr_local;
    }
    if ((local_30 == 0x31747261) || (local_30 == 0x32747261)) break;
    conn_ptr_local = (CONNECTIONLIST **)conn_ptr_local[4];
  }
  Parse_art(data,(RIFF_Chunk *)conn_ptr_local,conn_ptr,connList_ptr);
  return;
}

Assistant:

static void Parse_lart(DLS_Data *data, RIFF_Chunk *chunk, CONNECTIONLIST **conn_ptr, CONNECTION **connList_ptr)
{
	/* FIXME: This only supports one set of connections */
	for ( chunk = chunk->child; chunk; chunk = chunk->next ) {
		DWORD magic = (chunk->magic == FOURCC_LIST) ? chunk->subtype : chunk->magic;
		switch(magic) {
			case FOURCC_ART1:
			case FOURCC_ART2:
				Parse_art(data, chunk, conn_ptr, connList_ptr);
				return;
		}
	}
}